

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O1

void mi_option_init(mi_option_desc_t *desc)

{
  mi_option_t option;
  bool bVar1;
  _Bool _Var2;
  byte bVar3;
  size_t sVar4;
  char *pcVar5;
  ulong value;
  ulong uVar6;
  size_t sVar7;
  char *end;
  char buf [65];
  char s [65];
  byte *local_c0;
  byte local_b8 [80];
  char local_68 [72];
  
  _mi_strlcpy((char *)local_b8,"mimalloc_",0x41);
  _mi_strlcat((char *)local_b8,desc->name,0x41);
  _Var2 = _mi_getenv((char *)local_b8,local_68,0x41);
  if ((!_Var2) && (desc->legacy_name != (char *)0x0)) {
    _mi_strlcpy((char *)local_b8,"mimalloc_",0x41);
    _mi_strlcat((char *)local_b8,desc->legacy_name,0x41);
    _Var2 = _mi_getenv((char *)local_b8,local_68,0x41);
    if (_Var2) {
      _mi_warning_message("environment option \"mimalloc_%s\" is deprecated -- use \"mimalloc_%s\" instead.\n"
                          ,desc->legacy_name,desc->name);
    }
  }
  if (_Var2 == false) {
    _Var2 = _mi_preloading();
    if (_Var2) {
      return;
    }
    desc->init = DEFAULTED;
    return;
  }
  sVar4 = _mi_strnlen(local_68,0x40);
  if (sVar4 != 0) {
    sVar7 = 0;
    do {
      bVar3 = _mi_toupper(local_68[sVar7]);
      local_b8[sVar7] = bVar3;
      sVar7 = sVar7 + 1;
    } while (sVar4 != sVar7);
  }
  local_b8[sVar4] = 0;
  if ((local_b8[0] == 0) ||
     (pcVar5 = strstr("1;TRUE;YES;ON",(char *)local_b8), pcVar5 != (char *)0x0)) {
    desc->value = 1;
LAB_0093db69:
    desc->init = INITIALIZED;
    return;
  }
  pcVar5 = strstr("0;FALSE;NO;OFF",(char *)local_b8);
  if (pcVar5 != (char *)0x0) {
    desc->value = 0;
    goto LAB_0093db69;
  }
  local_c0 = local_b8;
  value = strtol((char *)local_b8,(char **)&local_c0,10);
  option = desc->option;
  if ((option != mi_option_arena_reserve) && (option != mi_option_reserve_os_memory))
  goto LAB_0093dcc1;
  uVar6 = 0;
  if (0 < (long)value) {
    uVar6 = value;
  }
  bVar3 = *local_c0;
  if (bVar3 < 0x4d) {
    if (bVar3 == 0x47) {
      bVar1 = 0xfffffffffff < (long)value;
      uVar6 = uVar6 << 0x14;
      goto LAB_0093dc5b;
    }
    if (bVar3 == 0x4b) {
      local_c0 = local_c0 + 1;
    }
    else {
LAB_0093dc22:
      uVar6 = uVar6 + 0x3ff >> 10;
    }
    bVar1 = false;
  }
  else {
    if (bVar3 == 0x4d) {
      bVar1 = 0x3fffffffffffff < (long)value;
      uVar6 = uVar6 << 10;
    }
    else {
      if (bVar3 != 0x54) goto LAB_0093dc22;
      bVar1 = 0x3ffffffff < (long)value;
      uVar6 = uVar6 << 0x1e;
    }
LAB_0093dc5b:
    local_c0 = local_c0 + 1;
  }
  if (*local_c0 == 0x42) {
    local_c0 = local_c0 + 1;
  }
  else if ((*local_c0 == 0x49) && (local_c0[1] == 0x42)) {
    local_c0 = local_c0 + 2;
  }
  value = 0x7fffffffffffffff;
  if (uVar6 < 0x7fffffffffffffff) {
    value = uVar6;
  }
  if (0xfffffffe0000 < uVar6) {
    value = 0x3fffffff80;
  }
  if (bVar1) {
    value = 0x3fffffff80;
  }
LAB_0093dcc1:
  if (*local_c0 == 0) {
    mi_option_set(option,value);
    return;
  }
  desc->init = DEFAULTED;
  if ((option == mi_option_verbose) && (desc->value == 0)) {
    desc->value = 1;
    _mi_warning_message("environment option mimalloc_%s has an invalid value.\n",desc->name);
    desc->value = 0;
    return;
  }
  _mi_warning_message("environment option mimalloc_%s has an invalid value.\n",desc->name);
  return;
}

Assistant:

static void mi_option_init(mi_option_desc_t* desc) {
  // Read option value from the environment
  char s[64 + 1];
  char buf[64+1];
  _mi_strlcpy(buf, "mimalloc_", sizeof(buf));
  _mi_strlcat(buf, desc->name, sizeof(buf));
  bool found = _mi_getenv(buf, s, sizeof(s));
  if (!found && desc->legacy_name != NULL) {
    _mi_strlcpy(buf, "mimalloc_", sizeof(buf));
    _mi_strlcat(buf, desc->legacy_name, sizeof(buf));
    found = _mi_getenv(buf, s, sizeof(s));
    if (found) {
      _mi_warning_message("environment option \"mimalloc_%s\" is deprecated -- use \"mimalloc_%s\" instead.\n", desc->legacy_name, desc->name);
    }
  }

  if (found) {
    size_t len = _mi_strnlen(s, sizeof(buf) - 1);
    for (size_t i = 0; i < len; i++) {
      buf[i] = _mi_toupper(s[i]);
    }
    buf[len] = 0;
    if (buf[0] == 0 || strstr("1;TRUE;YES;ON", buf) != NULL) {
      desc->value = 1;
      desc->init = INITIALIZED;
    }
    else if (strstr("0;FALSE;NO;OFF", buf) != NULL) {
      desc->value = 0;
      desc->init = INITIALIZED;
    }
    else {
      char* end = buf;
      long value = strtol(buf, &end, 10);
      if (mi_option_has_size_in_kib(desc->option)) {
        // this option is interpreted in KiB to prevent overflow of `long` for large allocations
        // (long is 32-bit on 64-bit windows, which allows for 4TiB max.)
        size_t size = (value < 0 ? 0 : (size_t)value);
        bool overflow = false;
        if (*end == 'K') { end++; }
        else if (*end == 'M') { overflow = mi_mul_overflow(size,MI_KiB,&size); end++; }
        else if (*end == 'G') { overflow = mi_mul_overflow(size,MI_MiB,&size); end++; }
        else if (*end == 'T') { overflow = mi_mul_overflow(size,MI_GiB,&size); end++; }
        else { size = (size + MI_KiB - 1) / MI_KiB; }
        if (end[0] == 'I' && end[1] == 'B') { end += 2; } // KiB, MiB, GiB, TiB
        else if (*end == 'B') { end++; }                  // Kb, Mb, Gb, Tb
        if (overflow || size > MI_MAX_ALLOC_SIZE) { size = (MI_MAX_ALLOC_SIZE / MI_KiB); }
        value = (size > LONG_MAX ? LONG_MAX : (long)size);
      }
      if (*end == 0) {
        mi_option_set(desc->option, value);
      }
      else {
        // set `init` first to avoid recursion through _mi_warning_message on mimalloc_verbose.
        desc->init = DEFAULTED;
        if (desc->option == mi_option_verbose && desc->value == 0) {
          // if the 'mimalloc_verbose' env var has a bogus value we'd never know
          // (since the value defaults to 'off') so in that case briefly enable verbose
          desc->value = 1;
          _mi_warning_message("environment option mimalloc_%s has an invalid value.\n", desc->name);
          desc->value = 0;
        }
        else {
          _mi_warning_message("environment option mimalloc_%s has an invalid value.\n", desc->name);
        }
      }
    }
    mi_assert_internal(desc->init != UNINIT);
  }
  else if (!_mi_preloading()) {
    desc->init = DEFAULTED;
  }
}